

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QRhiResource*,std::pair<int,bool>>::emplace_helper<std::pair<int,bool>>
          (QHash<QRhiResource*,std::pair<int,bool>> *this,QRhiResource **key,pair<int,_bool> *args)

{
  bool bVar1;
  piter pVar2;
  Entry *pEVar3;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QRhiResource*,std::pair<int,bool>>>::
  findOrInsert<QRhiResource*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QRhiResource*,std::pair<int,bool>>> **)this,key);
  pEVar3 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
           (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
           [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    *(QRhiResource **)(pEVar3->storage).data = *key;
    *(int *)((pEVar3->storage).data + 8) = args->first;
    (pEVar3->storage).data[0xc] = args->second;
  }
  else {
    bVar1 = args->second;
    *(int *)((pEVar3->storage).data + 8) = args->first;
    (pEVar3->storage).data[0xc] = bVar1;
  }
  pVar2.bucket = local_38._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }